

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_unpacked_star_expression.cpp
# Opt level: O1

void __thiscall
duckdb::Binder::ReplaceUnpackedStarExpression
          (Binder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,expression_list_t *star_list,StarExpression *star,
          optional_ptr<duckdb_re2::RE2,_true> regex)

{
  ExpressionClass EVar1;
  pointer puVar2;
  pointer pOVar3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var5;
  pointer pEVar6;
  pointer pEVar7;
  optional_ptr<duckdb_re2::RE2,_true> oVar8;
  bool bVar9;
  pointer pPVar10;
  BaseExpression *pBVar11;
  FunctionExpression *pFVar12;
  pointer pOVar13;
  reference pvVar14;
  reference pvVar15;
  OperatorExpression *pOVar16;
  reference pvVar17;
  type pPVar18;
  BinderException *pBVar19;
  NotImplementedException *this_00;
  OrderByNode *order;
  pointer pOVar20;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar21
  ;
  size_type __n;
  size_type __n_00;
  unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true> *this_01;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child;
  pointer puVar22;
  initializer_list<duckdb::ExpressionType> __l;
  expression_list_t new_orders;
  vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_> local_b8;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *local_a0;
  _Any_data local_98;
  pointer local_88;
  code *pcStack_80;
  expression_list_t *local_70;
  string local_68;
  optional_ptr<duckdb_re2::RE2,_true> local_48;
  StarExpression *local_40;
  Binder *local_38;
  
  local_a0 = expr;
  local_70 = star_list;
  local_48.ptr = regex.ptr;
  pPVar10 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            ::operator->(expr);
  oVar8 = local_48;
  puVar21 = local_a0;
  EVar1 = (pPVar10->super_BaseExpression).expression_class;
  local_38 = this;
  if (EVar1 != OPERATOR) {
    if (EVar1 == FUNCTION) {
      pBVar11 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(local_a0)->super_BaseExpression;
      pFVar12 = BaseExpression::Cast<duckdb::FunctionExpression>(pBVar11);
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      puVar22 = (pFVar12->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (pFVar12->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar22 != puVar2) {
        do {
          AddChild(puVar22,(expression_list_t *)&local_68,local_70,star,oVar8);
          puVar22 = puVar22 + 1;
        } while (puVar22 != puVar2);
      }
      local_98._M_unused._M_object =
           (pFVar12->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_98._8_8_ =
           (pFVar12->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_88 = (pFVar12->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pFVar12->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_68._M_dataplus._M_p;
      (pFVar12->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_68._M_string_length;
      (pFVar12->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_68.field_2._M_allocated_capacity;
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)&local_98);
      puVar21 = local_a0;
      if ((pFVar12->order_bys).
          super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
          super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
          .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl !=
          (OrderModifier *)0x0) {
        this_01 = &pFVar12->order_bys;
        local_b8.super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pOVar13 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                  ::operator->(this_01);
        pOVar3 = (pOVar13->orders).
                 super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pEVar6 = local_b8.
                 super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pEVar7 = local_b8.
                 super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pOVar20 = (pOVar13->orders).
                       super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                       super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            local_b8.
            super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
            _M_impl.super__Vector_impl_data._M_start = pEVar6,
            local_b8.
            super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
            _M_impl.super__Vector_impl_data._M_finish = pEVar7, pOVar20 != pOVar3;
            pOVar20 = pOVar20 + 1) {
          AddChild(&pOVar20->expression,(expression_list_t *)&local_b8,local_70,star,oVar8);
          pEVar6 = local_b8.
                   super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pEVar7 = local_b8.
                   super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        pOVar13 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                  ::operator->(this_01);
        puVar21 = local_a0;
        if ((long)pEVar7 - (long)pEVar6 >> 3 !=
            (long)(pOVar13->orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pOVar13->orders).
                  super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 4) {
          this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_98._M_unused._M_object = &local_88;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"*COLUMNS(...) is not supported in the order expression",""
                    );
          NotImplementedException::NotImplementedException(this_00,(string *)&local_98);
          __cxa_throw(this_00,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        if (local_b8.
            super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_b8.
            super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          __n = 0;
          do {
            pvVar14 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                      ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                    *)&local_b8,__n);
            pOVar13 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                      ::operator->(this_01);
            pvVar15 = vector<duckdb::OrderByNode,_true>::operator[](&pOVar13->orders,__n);
            _Var4._M_head_impl =
                 (pvVar14->
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (pvVar14->
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 (ParsedExpression *)0x0;
            _Var5._M_head_impl =
                 (pvVar15->expression).
                 super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                 .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
            (pvVar15->expression).
            super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
            .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                 _Var4._M_head_impl;
            if (_Var5._M_head_impl != (ParsedExpression *)0x0) {
              (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseExpression + 8))();
            }
            __n = __n + 1;
          } while (__n < (ulong)((long)local_b8.
                                       super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_b8.
                                       super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)&local_b8);
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)&local_68);
    }
LAB_011c2c33:
    pPVar18 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(puVar21);
    local_88 = (pointer)0x0;
    pcStack_80 = (code *)0x0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_98._M_unused._M_object = operator_new(0x20);
    *(Binder **)local_98._M_unused._0_8_ = local_38;
    *(expression_list_t **)((long)local_98._M_unused._0_8_ + 8) = local_70;
    *(StarExpression **)((long)local_98._M_unused._0_8_ + 0x10) = star;
    *(optional_ptr<duckdb_re2::RE2,_true> **)((long)local_98._M_unused._0_8_ + 0x18) = &local_48;
    pcStack_80 = ::std::
                 _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_unpacked_star_expression.cpp:122:53)>
                 ::_M_invoke;
    local_88 = (pointer)::std::
                        _Function_handler<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/expression/bind_unpacked_star_expression.cpp:122:53)>
                        ::_M_manager;
    ParsedExpressionIterator::EnumerateChildren
              (pPVar18,(function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
                        *)&local_98);
    if (local_88 != (pointer)0x0) {
      (*(code *)local_88)(&local_98,&local_98,3);
    }
    return;
  }
  pPVar18 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            ::operator*(local_a0);
  bVar9 = StarExpression::IsColumnsUnpacked(pPVar18);
  oVar8.ptr = local_48.ptr;
  if (bVar9) {
    pBVar19 = (BinderException *)__cxa_allocate_exception(0x10);
    local_98._M_unused._M_object = &local_88;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"*COLUMNS() can not be used in this place","");
    BinderException::BinderException(pBVar19,(string *)&local_98);
    __cxa_throw(pBVar19,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_40 = star;
  pBVar11 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(puVar21)->super_BaseExpression;
  pOVar16 = BaseExpression::Cast<duckdb::OperatorExpression>(pBVar11);
  local_98._0_3_ = 0x242398;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_98;
  ::std::vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>::vector
            (&local_b8,__l,(allocator_type *)&local_68);
  if (local_b8.super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_b8.super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    bVar9 = false;
    __n_00 = 0;
    do {
      pvVar17 = vector<duckdb::ExpressionType,_true>::operator[]
                          ((vector<duckdb::ExpressionType,_true> *)&local_b8,__n_00);
      star = local_40;
      if ((pOVar16->super_ParsedExpression).super_BaseExpression.type == *pvVar17) {
        bVar9 = true;
      }
      __n_00 = __n_00 + 1;
    } while ((__n_00 < (ulong)((long)local_b8.
                                     super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_b8.
                                    super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                                    ._M_impl.super__Vector_impl_data._M_start)) && (!bVar9));
    if (bVar9) {
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      puVar22 = (pOVar16->children).
                super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (pOVar16->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar22 != puVar2) {
        do {
          AddChild(puVar22,(expression_list_t *)&local_68,local_70,star,oVar8);
          puVar22 = puVar22 + 1;
        } while (puVar22 != puVar2);
      }
      local_98._M_unused._M_object =
           (pOVar16->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_98._8_8_ =
           (pOVar16->children).
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_88 = (pOVar16->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pOVar16->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_68._M_dataplus._M_p;
      (pOVar16->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_68._M_string_length;
      (pOVar16->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_68.field_2._M_allocated_capacity;
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)&local_98);
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 *)&local_68);
      puVar21 = local_a0;
      if (local_b8.
          super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.
                        super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        puVar21 = local_a0;
      }
      goto LAB_011c2c33;
    }
  }
  pBVar19 = (BinderException *)__cxa_allocate_exception(0x10);
  local_98._M_unused._M_object = &local_88;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"*COLUMNS() can not be used together with the \'%s\' operator","");
  EnumUtil::ToString<duckdb::ExpressionType>
            (&local_68,(pOVar16->super_ParsedExpression).super_BaseExpression.type);
  BinderException::BinderException<std::__cxx11::string>(pBVar19,(string *)&local_98,&local_68);
  __cxa_throw(pBVar19,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Binder::ReplaceUnpackedStarExpression(unique_ptr<ParsedExpression> &expr, expression_list_t &star_list,
                                           StarExpression &star, optional_ptr<duckdb_re2::RE2> regex) {
	D_ASSERT(expr);
	auto expression_class = expr->GetExpressionClass();
	// Replace *COLUMNS(...) in the supported places
	switch (expression_class) {
	case ExpressionClass::FUNCTION: {
		ReplaceInFunction(expr, star_list, star, regex);
		break;
	}
	case ExpressionClass::OPERATOR: {
		if (StarExpression::IsColumnsUnpacked(*expr)) {
			throw BinderException("*COLUMNS() can not be used in this place");
		}
		ReplaceInOperator(expr, star_list, star, regex);
		break;
	}
	default: {
		break;
	}
	}

	// Visit the children of this expression, collecting the unpacked expressions
	ParsedExpressionIterator::EnumerateChildren(*expr, [&](unique_ptr<ParsedExpression> &child_expr) {
		ReplaceUnpackedStarExpression(child_expr, star_list, star, regex);
	});
}